

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O2

_Bool AES_CCM_Decrypt(COSE_Enveloped *pcose,int TSize,int LSize,byte *pbKey,size_t cbKey,
                     byte *pbCrypto,size_t cbCrypto,byte *pbAuthData,size_t cbAuthData,
                     cose_errback *perr)

{
  int iVar1;
  cn_cbor *pcVar2;
  uchar *output;
  size_t __nmemb;
  cose_error cVar3;
  int iVar4;
  byte rgbIV [15];
  mbedtls_ccm_context ctx;
  
  rgbIV[8] = '\0';
  rgbIV[9] = '\0';
  rgbIV[10] = '\0';
  rgbIV[0xb] = '\0';
  rgbIV[0xc] = '\0';
  rgbIV[0xd] = '\0';
  rgbIV[0xe] = '\0';
  rgbIV[0] = '\0';
  rgbIV[1] = '\0';
  rgbIV[2] = '\0';
  rgbIV[3] = '\0';
  rgbIV[4] = '\0';
  rgbIV[5] = '\0';
  rgbIV[6] = '\0';
  rgbIV[7] = '\0';
  mbedtls_ccm_init(&ctx);
  pcVar2 = _COSE_map_get_int(&pcose->m_message,5,7,(cose_errback *)0x0);
  if (((pcVar2 == (cn_cbor *)0x0) || (pcVar2->type != CN_CBOR_BYTES)) ||
     (iVar4 = LSize / -8 + 0xf, pcVar2->length != iVar4)) {
    output = (uchar *)0x0;
    if (perr == (cose_errback *)0x0) goto LAB_001cca72;
    cVar3 = COSE_ERR_INVALID_PARAMETER;
LAB_001cca6d:
    output = (uchar *)0x0;
  }
  else {
    memcpy(rgbIV,(pcVar2->v).bytes,(long)iVar4);
    iVar1 = mbedtls_ccm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,pbKey,(int)cbKey << 3);
    if (iVar1 != 0) {
      output = (uchar *)0x0;
      if (perr == (cose_errback *)0x0) goto LAB_001cca72;
      cVar3 = COSE_ERR_CRYPTO_FAIL;
      goto LAB_001cca6d;
    }
    cVar3 = COSE_ERR_CRYPTO_FAIL;
    __nmemb = (size_t)((int)cbCrypto - TSize / 8);
    output = (uchar *)calloc(__nmemb,1);
    if (output == (uchar *)0x0) {
      output = (uchar *)0x0;
      if (perr == (cose_errback *)0x0) goto LAB_001cca72;
      cVar3 = COSE_ERR_OUT_OF_MEMORY;
      goto LAB_001cca6d;
    }
    iVar4 = mbedtls_ccm_auth_decrypt
                      (&ctx,__nmemb,rgbIV,(long)iVar4,pbAuthData,cbAuthData,pbCrypto,output,
                       pbCrypto + __nmemb,(long)(TSize / 8));
    if (iVar4 == 0) {
      mbedtls_ccm_free(&ctx);
      pcose->pbContent = output;
      pcose->cbContent = __nmemb;
      return true;
    }
    if (perr == (cose_errback *)0x0) goto LAB_001cca72;
  }
  perr->err = cVar3;
LAB_001cca72:
  free(output);
  mbedtls_ccm_free(&ctx);
  return false;
}

Assistant:

bool AES_CCM_Decrypt(COSE_Enveloped * pcose, int TSize, int LSize, const byte * pbKey, size_t cbKey, const byte * pbCrypto, size_t cbCrypto, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{

	mbedtls_ccm_context ctx;
	int cbOut;
	byte * rgbOut = NULL;
	int NSize = 15 - (LSize/8);
	byte rgbIV[15] = { 0 };
	const cn_cbor * pIV = NULL;
	mbedtls_cipher_id_t cipher;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif

	mbedtls_ccm_init(&ctx);
	
        //  Setup the IV/Nonce and put it into the message
	pIV = _COSE_map_get_int(&pcose->m_message, COSE_Header_IV, COSE_BOTH, NULL);
	if ((pIV == NULL) || (pIV->type!= CN_CBOR_BYTES)) {
		if (perr != NULL) perr->err = COSE_ERR_INVALID_PARAMETER;

	errorReturn:
		if (rgbOut != NULL) COSE_FREE(rgbOut, context);
		mbedtls_ccm_free(&ctx);
		return false;
	}
	CHECK_CONDITION(pIV->length == NSize, COSE_ERR_INVALID_PARAMETER);
	memcpy(rgbIV, pIV->v.str, pIV->length);

	//  Setup and run the mbedTLS code
	cipher = MBEDTLS_CIPHER_ID_AES;
	
        CHECK_CONDITION(!mbedtls_ccm_setkey(&ctx, cipher, pbKey, cbKey*8), COSE_ERR_CRYPTO_FAIL);
	TSize /= 8; // Comes in in bits not bytes.

	cbOut = (int)  cbCrypto - TSize;
	rgbOut = (byte *)COSE_CALLOC(cbOut, 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);
        
		
	CHECK_CONDITION(!mbedtls_ccm_auth_decrypt(&ctx, cbOut, rgbIV, NSize, pbAuthData, cbAuthData, pbCrypto, rgbOut, &pbCrypto[cbOut], TSize), COSE_ERR_CRYPTO_FAIL);
        
	mbedtls_ccm_free(&ctx);
	pcose->pbContent = rgbOut;
	pcose->cbContent = cbOut;

	return true;
}